

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

void mu_begin_panel_ex(mu_Context *ctx,char *name,int opt)

{
  size_t sVar1;
  mu_Container *cnt_00;
  mu_Rect mVar2;
  undefined8 local_38;
  undefined8 local_30;
  mu_Container *cnt;
  int opt_local;
  char *name_local;
  mu_Context *ctx_local;
  
  sVar1 = strlen(name);
  mu_push_id(ctx,name,(int)sVar1);
  cnt_00 = get_container(ctx,ctx->last_id,opt);
  mVar2 = mu_layout_next(ctx);
  local_38 = mVar2._0_8_;
  (cnt_00->rect).x = (undefined4)local_38;
  (cnt_00->rect).y = local_38._4_4_;
  local_30 = mVar2._8_8_;
  (cnt_00->rect).w = (undefined4)local_30;
  (cnt_00->rect).h = local_30._4_4_;
  if (((opt ^ 0xffffffffU) & 8) != 0) {
    (*ctx->draw_frame)(ctx,cnt_00->rect,5);
  }
  if (0x1f < (ctx->container_stack).idx) {
    fprintf(_stderr,"Fatal error: %s:%d: assertion \'%s\' failed\n",
            "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/microui/microui.c"
            ,0x4b1,
            "(ctx->container_stack).idx < (int) (sizeof((ctx->container_stack).items) / sizeof(*(ctx->container_stack).items))"
           );
    abort();
  }
  (ctx->container_stack).items[(ctx->container_stack).idx] = cnt_00;
  (ctx->container_stack).idx = (ctx->container_stack).idx + 1;
  push_container_body(ctx,cnt_00,cnt_00->rect,opt);
  mu_push_clip_rect(ctx,cnt_00->body);
  return;
}

Assistant:

void mu_begin_panel_ex(mu_Context *ctx, const char *name, int opt) {
  mu_Container *cnt;
  mu_push_id(ctx, name, strlen(name));
  cnt = get_container(ctx, ctx->last_id, opt);
  cnt->rect = mu_layout_next(ctx);
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, cnt->rect, MU_COLOR_PANELBG);
  }
  push(ctx->container_stack, cnt);
  push_container_body(ctx, cnt, cnt->rect, opt);
  mu_push_clip_rect(ctx, cnt->body);
}